

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_clib___index(lua_State *L)

{
  uint uVar1;
  int iVar2;
  TValue *o;
  long *sp_00;
  uint *puVar3;
  long in_RDI;
  CType *ct;
  void *sp;
  CTypeID sid;
  CType *s;
  GCcdata *cd;
  CTState *cts;
  TValue *tv;
  CType *ct_1;
  CTState *cts_1;
  lua_State *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  CTState *in_stack_ffffffffffffff50;
  uint *local_98;
  
  o = ffi_clib_index(in_stack_ffffffffffffff10);
  if ((o->field_2).it == 0xfffffff5) {
    sp_00 = (long *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0xfc);
    sp_00[2] = in_RDI;
    puVar3 = (uint *)(*sp_00 + (ulong)*(ushort *)((ulong)(o->u32).lo + 6) * 0x10);
    if (*puVar3 >> 0x1c == 0xc) {
      uVar1 = *puVar3 & 0xffff;
      for (local_98 = (uint *)(*sp_00 + (ulong)uVar1 * 0x10); *local_98 >> 0x1c == 8;
          local_98 = (uint *)(*sp_00 + (ulong)(*local_98 & 0xffff) * 0x10)) {
      }
      iVar2 = lj_cconv_tv_ct(in_stack_ffffffffffffff50,
                             (CType *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                             (CTypeID)((ulong)in_RDI >> 0x20),o,(uint8_t *)sp_00);
      if (iVar2 == 0) {
        return 1;
      }
      if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20) <
          *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24)) {
        return 1;
      }
      lj_gc_step((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffff18));
      return 1;
    }
  }
  *(TValue *)(*(long *)(in_RDI + 0x18) + -8) = *o;
  return 1;
}

Assistant:

LJLIB_CF(ffi_clib___index)	LJLIB_REC(clib_index 1)
{
  TValue *tv = ffi_clib_index(L);
  if (tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *s = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(s->info)) {
      CTypeID sid = ctype_cid(s->info);
      void *sp = *(void **)cdataptr(cd);
      CType *ct = ctype_raw(cts, sid);
      if (lj_cconv_tv_ct(cts, ct, sid, L->top-1, sp))
	lj_gc_check(L);
      return 1;
    }
  }
  copyTV(L, L->top-1, tv);
  return 1;
}